

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_impl.hpp
# Opt level: O2

int64_t duckdb_jaro_winkler::detail::count_transpositions_block<char_const*>
                  (BlockPatternMatchVector *PM,char *T_first,char *param_3,
                  FlaggedCharsMultiword *flagged,int64_t FlaggedChars)

{
  long lVar1;
  uint64_t uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long block;
  ulong uVar6;
  
  uVar4 = **(ulong **)(param_3 + 0x18);
  uVar6 = **(ulong **)param_3;
  lVar3 = 0;
  block = 0;
  lVar5 = 0;
  while (flagged != (FlaggedCharsMultiword *)0x0) {
    while (uVar4 == 0) {
      T_first = T_first + 0x40;
      lVar1 = lVar3 * 8;
      lVar3 = lVar3 + 1;
      uVar4 = *(ulong *)(*(long *)(param_3 + 0x18) + 8 + lVar1);
    }
    for (; uVar4 != 0; uVar4 = uVar4 & uVar4 - 1) {
      while (uVar6 == 0) {
        lVar1 = block * 8;
        block = block + 1;
        uVar6 = *(ulong *)(*(long *)param_3 + 8 + lVar1);
      }
      lVar1 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
        }
      }
      uVar2 = common::BlockPatternMatchVector::get<char>(PM,block,T_first[lVar1]);
      lVar5 = lVar5 + (ulong)((uVar2 & -uVar6 & uVar6) == 0);
      uVar6 = uVar6 ^ -uVar6 & uVar6;
      flagged = (FlaggedCharsMultiword *)
                ((long)&flagged[-1].T_flag.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7);
    }
    uVar4 = 0;
  }
  return lVar5;
}

Assistant:

static inline int64_t
count_transpositions_block(const common::BlockPatternMatchVector& PM, InputIt1 T_first, InputIt1,
                           const FlaggedCharsMultiword& flagged, int64_t FlaggedChars)
{
    using namespace intrinsics;
    int64_t TextWord = 0;
    int64_t PatternWord = 0;
    uint64_t T_flag = flagged.T_flag[static_cast<size_t>(TextWord)];
    uint64_t P_flag = flagged.P_flag[static_cast<size_t>(PatternWord)];

    int64_t Transpositions = 0;
    while (FlaggedChars) {
        while (!T_flag) {
            TextWord++;
            T_first += 64;
            T_flag = flagged.T_flag[static_cast<size_t>(TextWord)];
        }

        while (T_flag) {
            while (!P_flag) {
                PatternWord++;
                P_flag = flagged.P_flag[static_cast<size_t>(PatternWord)];
            }

            uint64_t PatternFlagMask = blsi(P_flag);

            Transpositions += !(PM.get(PatternWord, T_first[tzcnt(T_flag)]) & PatternFlagMask);

            T_flag = blsr(T_flag);
            P_flag ^= PatternFlagMask;

            FlaggedChars--;
        }
    }

    return Transpositions;
}